

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::cpp_function::destruct(function_record *rec,bool free_strings)

{
  function_record *pfVar1;
  bool bVar2;
  reference paVar3;
  argument_record *arg_1;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range3;
  argument_record *arg;
  iterator __end4;
  iterator __begin4;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range4;
  function_record *next;
  function_record *pfStack_10;
  bool free_strings_local;
  function_record *rec_local;
  
  pfVar1 = rec;
  while (pfStack_10 = pfVar1, pfStack_10 != (function_record *)0x0) {
    pfVar1 = pfStack_10->next;
    if (pfStack_10->free_data != (_func_void_function_record_ptr *)0x0) {
      (*pfStack_10->free_data)(pfStack_10);
    }
    if (free_strings) {
      free(pfStack_10->name);
      free(pfStack_10->doc);
      free(pfStack_10->signature);
      __end4 = std::
               vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ::begin(&pfStack_10->args);
      arg = (argument_record *)
            std::
            vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ::end(&pfStack_10->args);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                         *)&arg), bVar2) {
        paVar3 = __gnu_cxx::
                 __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                 ::operator*(&__end4);
        free(*(void **)paVar3);
        free(*(void **)(paVar3 + 8));
        __gnu_cxx::
        __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
        ::operator++(&__end4);
      }
    }
    __end3 = std::
             vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             ::begin(&pfStack_10->args);
    arg_1 = (argument_record *)
            std::
            vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ::end(&pfStack_10->args);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                       *)&arg_1), bVar2) {
      paVar3 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end3);
      handle::dec_ref((handle *)(paVar3 + 0x10));
      __gnu_cxx::
      __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
      ::operator++(&__end3);
    }
    if (pfStack_10->def != (PyMethodDef *)0x0) {
      free(pfStack_10->def->ml_doc);
      if (pfStack_10->def != (PyMethodDef *)0x0) {
        operator_delete(pfStack_10->def);
      }
    }
    if (pfStack_10 != (function_record *)0x0) {
      detail::function_record::~function_record(pfStack_10);
      operator_delete(pfStack_10);
    }
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec, bool free_strings = true) {
        // If on Python 3.9, check the interpreter "MICRO" (patch) version.
        // If this is running on 3.9.0, we have to work around a bug.
        #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
            static bool is_zero = Py_GetVersion()[4] == '0';
        #endif

        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            // During initialization, these strings might not have been copied yet,
            // so they cannot be freed. Once the function has been created, they can.
            // Check `make_function_record` for more details.
            if (free_strings) {
                std::free((char *) rec->name);
                std::free((char *) rec->doc);
                std::free((char *) rec->signature);
                for (auto &arg: rec->args) {
                    std::free(const_cast<char *>(arg.name));
                    std::free(const_cast<char *>(arg.descr));
                }
            }
            for (auto &arg: rec->args)
                arg.value.dec_ref();
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                // Python 3.9.0 decref's these in the wrong order; rec->def
                // If loaded on 3.9.0, let these leak (use Python 3.9.1 at runtime to fix)
                // See https://github.com/python/cpython/pull/22670
                #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
                    if (!is_zero)
                        delete rec->def;
                #else
                    delete rec->def;
                #endif
            }
            delete rec;
            rec = next;
        }
    }